

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall Warning::Warning(Warning *this)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *in_RDI;
  
  uVar2 = std::ios::rdbuf();
  *in_RDI = uVar2;
  std::__cxx11::stringstream::stringstream((stringstream *)(in_RDI + 1));
  lVar1 = *(long *)(std::cerr + -0x18);
  std::__cxx11::stringstream::rdbuf();
  std::ios::rdbuf((streambuf *)((long)&std::cerr + lVar1));
  return;
}

Assistant:

Warning() : backup(std::cerr.rdbuf()), buf{} { std::cerr.rdbuf(buf.rdbuf()); }